

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O2

Amap_Nod_t * Amap_LibCreateObj(Amap_Lib_t *p)

{
  int iVar1;
  Amap_Lib_t *__ptr;
  Vec_Int_t *pVVar2;
  long lVar3;
  Amap_Lib_t *__size;
  Amap_Lib_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  
  iVar7 = p->nNodes;
  __ptr = (Amap_Lib_t *)p->pNodes;
  __size = p;
  if (iVar7 == p->nNodesAlloc) {
    __size = (Amap_Lib_t *)((long)iVar7 * 0x30);
    if (__ptr == (Amap_Lib_t *)0x0) {
      __ptr = (Amap_Lib_t *)malloc((size_t)__size);
      iVar1 = iVar7;
    }
    else {
      pAVar4 = __ptr;
      __ptr = (Amap_Lib_t *)realloc(__ptr,(size_t)__size);
      iVar7 = p->nNodes;
      __size = pAVar4;
      iVar1 = p->nNodesAlloc;
    }
    p->pNodes = (Amap_Nod_t *)__ptr;
    p->nNodesAlloc = iVar1 * 2;
  }
  lVar3 = (long)iVar7;
  (&__ptr->pName)[lVar3 * 3] = (char *)0x0;
  (&__ptr->pName + lVar3 * 3)[1] = (char *)0x0;
  (&__ptr->vSorted)[lVar3 * 3] = (Vec_Ptr_t *)0x0;
  iVar7 = p->nNodes;
  p->nNodes = iVar7 + 1;
  *(short *)(&__ptr->pName + lVar3 * 3) = (short)iVar7;
  pVVar5 = p->vRules;
  pVVar2 = Vec_IntAlloc((int)__size);
  Vec_PtrPush(pVVar5,pVVar2);
  pVVar6 = p->vRules;
  pVVar2 = Vec_IntAlloc((int)pVVar5);
  Vec_PtrPush(pVVar6,pVVar2);
  pVVar5 = p->vRulesX;
  pVVar2 = Vec_IntAlloc((int)pVVar6);
  Vec_PtrPush(pVVar5,pVVar2);
  pVVar6 = p->vRulesX;
  pVVar2 = Vec_IntAlloc((int)pVVar5);
  Vec_PtrPush(pVVar6,pVVar2);
  return (Amap_Nod_t *)(&__ptr->pName + lVar3 * 3);
}

Assistant:

Amap_Nod_t * Amap_LibCreateObj( Amap_Lib_t * p )
{
    Amap_Nod_t * pNode;
    if ( p->nNodes == p->nNodesAlloc )
    {
        p->pNodes = ABC_REALLOC( Amap_Nod_t, p->pNodes, 2*p->nNodesAlloc );
        p->nNodesAlloc *= 2;
    }
    pNode = Amap_LibNod( p, p->nNodes );
    memset( pNode, 0, sizeof(Amap_Nod_t) );
    pNode->Id = p->nNodes++;
    Vec_PtrPush( p->vRules, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRules, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRulesX, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRulesX, Vec_IntAlloc(8) );
    return pNode;
}